

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

void anon_unknown.dwarf_18993::op_adc_16(EmulateRegisters *regs,uint16_t value)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint32_t sum;
  uint32_t carry;
  uint16_t a16;
  uint16_t flags_value;
  uint16_t flags_affected;
  uint16_t value_local;
  EmulateRegisters *regs_local;
  
  sum._2_2_ = 0;
  uVar2 = snestistics::EmulateRegisters::A(regs,0xffff);
  bVar1 = snestistics::EmulateRegisters::P_flag(regs,Carry);
  uVar3 = (uint)uVar2 + (uint)value + (uint)bVar1;
  if ((uVar3 & 0xffff) == 0) {
    sum._2_2_ = 2;
  }
  if (0xffff < uVar3) {
    sum._2_2_ = sum._2_2_ | 1;
  }
  if ((uVar3 & 0x8000) != 0) {
    sum._2_2_ = sum._2_2_ | 0x80;
  }
  if ((((uVar2 ^ value) ^ 0xffffffff) & ((uint)value ^ uVar3 & 0xffff) & 0x8000) != 0) {
    sum._2_2_ = sum._2_2_ | 0x40;
  }
  snestistics::EmulateRegisters::set_A(regs,(uint16_t)uVar3,0xffff);
  snestistics::EmulateRegisters::set_P(regs,sum._2_2_,0xc3);
  return;
}

Assistant:

inline void op_adc_16(EmulateRegisters &regs, const uint16_t value) {
	const uint16_t flags_affected = 
		(uint16_t)ProcessorStatusFlag::Carry|
		(uint16_t)ProcessorStatusFlag::Negative|
		(uint16_t)ProcessorStatusFlag::Zero|
		(uint16_t)ProcessorStatusFlag::Overflow;
	uint16_t flags_value = 0;

	const uint16_t a16 = regs.A();

	const uint32_t carry = regs.P_flag(ProcessorStatusFlag::Carry) == 0 ? 0 : 1;
	const uint32_t sum = a16 + value + carry;

	if ((sum&0xFFFF)==0) flags_value |= (uint16_t)ProcessorStatusFlag::Zero;
	if (sum >= 0x10000) flags_value |= (uint16_t)ProcessorStatusFlag::Carry;
	if (sum & 0x8000 ) flags_value |= (uint16_t)ProcessorStatusFlag::Negative;

	// NOTE: For a signed overflow to happen both A and value must have the same sign
	if (((~(a16 ^ value)) & (value ^ (uint16_t)sum)) & 0x8000)
		flags_value |= (uint16_t)ProcessorStatusFlag::Overflow;

	regs.set_A((uint16_t)sum);
	regs.set_P(flags_value, flags_affected);
}